

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

bool __thiscall
HighsMipSolverData::addIncumbent
          (HighsMipSolverData *this,vector<double,_std::allocator<double>_> *sol,double solobj,
          int solution_source,bool print_display_line,bool is_user_solution)

{
  byte bVar1;
  bool bVar2;
  byte in_CL;
  byte bVar3;
  undefined4 in_EDX;
  double in_RSI;
  HighsMipSolverData *in_RDI;
  byte in_R8B;
  double in_XMM0_Qa;
  double dVar4;
  reference rVar5;
  HighsMipSolverData *unaff_retaddr;
  HighsNodeQueue *in_stack_00000010;
  bool in_stack_0000001e;
  bool in_stack_0000001f;
  double in_stack_00000020;
  double in_stack_00000028;
  double in_stack_00000030;
  double in_stack_00000038;
  HighsMipSolverData *in_stack_00000040;
  double new_upper_limit;
  bool bound_change;
  double prev_upper_bound;
  double transformed_solobj;
  bool get_transformed_solution;
  HighsMipSolver *in_stack_00000068;
  bool possibly_store_as_new_incumbent;
  HighsRedcostFixing *in_stack_00000070;
  bool execute_mip_solution_callback;
  HighsDomain *in_stack_000001f8;
  HighsMipSolver *in_stack_00000248;
  HighsCliqueTable *in_stack_00000250;
  int in_stack_00000344;
  HighsMipSolverData *in_stack_00000348;
  undefined1 in_stack_00005b3f;
  vector<double,_std::allocator<double>_> *in_stack_00005b40;
  HighsMipSolverData *in_stack_00005b48;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *in_stack_ffffffffffffff60;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 uVar6;
  undefined1 in_stack_ffffffffffffff6f;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 uVar7;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff80;
  double local_78;
  HighsCDouble local_70;
  double local_60;
  undefined1 local_51;
  double local_50;
  double local_48;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 uVar8;
  byte bVar9;
  HighsNodeQueue *in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffd8;
  HighsMipSolverData *this_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar3 = in_CL & 1;
  bVar1 = in_R8B & 1;
  uVar7 = false;
  this_00 = in_RDI;
  if ((bVar1 == 0) &&
     (uVar7 = false,
     ((ulong)(((_Vector_base<double,_std::allocator<double>_> *)&in_RDI->mipsolver)->_M_impl).
             super__Vector_impl_data._M_start[0x16] & 1) == 0)) {
    bVar2 = std::function::operator_cast_to_bool(in_stack_ffffffffffffff60);
    if (bVar2) {
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (in_stack_ffffffffffffff80,CONCAT17(uVar7,in_stack_ffffffffffffff78));
      in_stack_ffffffffffffffc8 = (HighsNodeQueue *)rVar5._M_p;
      in_stack_ffffffffffffff6f =
           std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffffc8);
      uVar7 = in_stack_ffffffffffffff6f;
    }
    else {
      in_stack_ffffffffffffff6f = false;
      uVar7 = in_stack_ffffffffffffff6f;
    }
  }
  bVar9 = in_XMM0_Qa < in_RDI->upper_bound;
  uVar6 = true;
  if (!(bool)bVar9) {
    uVar6 = uVar7;
  }
  uVar8 = uVar6;
  if ((bool)uVar6 == false) {
    local_48 = 0.0;
  }
  else {
    local_48 = transformNewIntegerFeasibleSolution
                         (in_stack_00005b48,in_stack_00005b40,(bool)in_stack_00005b3f);
  }
  if ((bVar9 & 1) == 0) {
    bVar2 = std::vector<double,_std::allocator<double>_>::empty
                      ((vector<double,_std::allocator<double>_> *)in_RDI);
    if (bVar2) {
      std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)unaff_retaddr,
                 (vector<double,_std::allocator<double>_> *)
                 CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    }
  }
  else {
    if (in_RDI->upper_bound <= local_48) {
      return false;
    }
    local_50 = in_RDI->upper_bound;
    in_RDI->upper_bound = local_48;
    local_51 = in_RDI->upper_bound != local_50;
    dVar4 = local_48;
    if ((((ulong)(((_Vector_base<double,_std::allocator<double>_> *)&in_RDI->mipsolver)->_M_impl).
                 super__Vector_impl_data._M_start[0x16] & 1) == 0) && ((bool)local_51)) {
      updatePrimalDualIntegral
                (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028,
                 in_stack_00000020,in_stack_0000001f,in_stack_0000001e);
    }
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)unaff_retaddr,
               (vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    local_60 = computeNewUpperLimit
                         (this_00,in_RSI,dVar4,
                          (double)CONCAT44(in_EDX,CONCAT13(bVar3,CONCAT12(bVar1,CONCAT11(uVar7,
                                                  in_stack_ffffffffffffffd8)))));
    if (((bVar1 & 1) == 0) &&
       (((ulong)(((_Vector_base<double,_std::allocator<double>_> *)&in_RDI->mipsolver)->_M_impl).
                super__Vector_impl_data._M_start[0x16] & 1) == 0)) {
      saveReportMipSolution
                (unaff_retaddr,(double)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
                );
    }
    if (local_60 < in_RDI->upper_limit) {
      in_RDI->numImprovingSols = in_RDI->numImprovingSols + 1;
      in_RDI->upper_limit = local_60;
      dVar4 = computeNewUpperLimit
                        (this_00,in_RSI,dVar4,
                         (double)CONCAT44(in_EDX,CONCAT13(bVar3,CONCAT12(bVar1,CONCAT11(uVar7,
                                                  in_stack_ffffffffffffffd8)))));
      in_RDI->optimality_limit = dVar4;
      HighsNodeQueue::setOptimalityLimit(&in_RDI->nodequeue,in_RDI->optimality_limit);
      HighsDebugSol::newIncumbentFound((HighsDebugSol *)&in_RDI->field_0x68b0);
      HighsDomain::propagate(in_stack_000001f8);
      bVar2 = HighsDomain::infeasible(&in_RDI->domain);
      if (!bVar2) {
        HighsRedcostFixing::propagateRootRedcost(in_stack_00000070,in_stack_00000068);
      }
      bVar2 = HighsDomain::infeasible(&in_RDI->domain);
      if (bVar2) {
        HighsCDouble::HighsCDouble(&local_70,1.0);
        (in_RDI->pruned_treeweight).hi = local_70.hi;
        (in_RDI->pruned_treeweight).lo = local_70.lo;
        HighsNodeQueue::clear(in_stack_00000010);
        if ((bVar3 & 1) != 0) {
          printDisplayLine(in_stack_00000348,in_stack_00000344);
        }
        return true;
      }
      HighsCliqueTable::extractObjCliques(in_stack_00000250,in_stack_00000248);
      bVar2 = HighsDomain::infeasible(&in_RDI->domain);
      if (bVar2) {
        HighsCDouble::HighsCDouble((HighsCDouble *)&stack0xffffffffffffff80,1.0);
        (in_RDI->pruned_treeweight).hi = (double)in_stack_ffffffffffffff80;
        (in_RDI->pruned_treeweight).lo = local_78;
        HighsNodeQueue::clear(in_stack_00000010);
        if ((bVar3 & 1) != 0) {
          printDisplayLine(in_stack_00000348,in_stack_00000344);
        }
        return true;
      }
      HighsNodeQueue::performBounding
                (in_stack_ffffffffffffffc8,
                 (double)CONCAT17(bVar9,CONCAT16(uVar8,in_stack_ffffffffffffffc0)));
      HighsCDouble::operator+=
                ((HighsCDouble *)in_RDI,
                 (double)CONCAT17(in_stack_ffffffffffffff6f,
                                  CONCAT16(uVar6,in_stack_ffffffffffffff68)));
      printDisplayLine(in_stack_00000348,in_stack_00000344);
    }
  }
  return true;
}

Assistant:

bool HighsMipSolverData::addIncumbent(const std::vector<double>& sol,
                                      double solobj, const int solution_source,
                                      const bool print_display_line,
                                      const bool is_user_solution) {
  const bool execute_mip_solution_callback =
      !is_user_solution && !mipsolver.submip &&
      (mipsolver.callback_->user_callback
           ? mipsolver.callback_->active[kCallbackMipSolution]
           : false);
  // Determine whether the potential new incumbent should be
  // transformed
  //
  // Happens if solobj improves on the upper bound or the MIP solution
  // callback is active
  const bool possibly_store_as_new_incumbent = solobj < upper_bound;
  const bool get_transformed_solution =
      possibly_store_as_new_incumbent || execute_mip_solution_callback;
  // Get the transformed objective and solution if required
  const double transformed_solobj =
      get_transformed_solution ? transformNewIntegerFeasibleSolution(
                                     sol, possibly_store_as_new_incumbent)
                               : 0;

  if (possibly_store_as_new_incumbent) {
    solobj = transformed_solobj;
    if (solobj >= upper_bound) return false;

    double prev_upper_bound = upper_bound;

    upper_bound = solobj;

    bool bound_change = upper_bound != prev_upper_bound;
    if (!mipsolver.submip && bound_change)
      updatePrimalDualIntegral(lower_bound, lower_bound, prev_upper_bound,
                               upper_bound);

    incumbent = sol;
    double new_upper_limit = computeNewUpperLimit(solobj, 0.0, 0.0);

    if (!is_user_solution && !mipsolver.submip)
      saveReportMipSolution(new_upper_limit);
    if (new_upper_limit < upper_limit) {
      ++numImprovingSols;
      upper_limit = new_upper_limit;
      optimality_limit =
          computeNewUpperLimit(solobj, mipsolver.options_mip_->mip_abs_gap,
                               mipsolver.options_mip_->mip_rel_gap);
      nodequeue.setOptimalityLimit(optimality_limit);
      debugSolution.newIncumbentFound();
      domain.propagate();
      if (!domain.infeasible()) redcostfixing.propagateRootRedcost(mipsolver);

      // Two calls to printDisplayLine added for completeness,
      // ensuring that when the root node has an integer solution, a
      // logging line is issued

      if (domain.infeasible()) {
        pruned_treeweight = 1.0;
        nodequeue.clear();
        if (print_display_line)
          printDisplayLine(solution_source);  // Added for completeness
        return true;
      }
      cliquetable.extractObjCliques(mipsolver);
      if (domain.infeasible()) {
        pruned_treeweight = 1.0;
        nodequeue.clear();
        if (print_display_line)
          printDisplayLine(solution_source);  // Added for completeness
        return true;
      }
      pruned_treeweight += nodequeue.performBounding(upper_limit);
      printDisplayLine(solution_source);
    }
  } else if (incumbent.empty())
    incumbent = sol;

  return true;
}